

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O3

bool icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
               (UnicodeString *affixPattern,UnicodeSet *ignorables,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  UErrorCode *in_R8;
  AffixTag tag;
  AffixTag AVar5;
  AffixTag local_40;
  
  AVar5 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 != 0) {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar5.type;
    local_40.state = STATE_BASE;
    bVar2 = hasNext(&local_40,affixPattern);
    if (!bVar2) {
      return true;
    }
    AVar5 = local_40;
    do {
      tag._8_8_ = affixPattern;
      tag.offset = (int)AVar5._8_8_;
      tag.codePoint = (int)((ulong)AVar5._8_8_ >> 0x20);
      AVar5 = nextToken(AVar5._0_8_,tag,(UnicodeString *)status,in_R8);
      if ((U_ZERO_ERROR < *status) ||
         ((local_40 = AVar5, AVar5._8_8_ >> 0x20 == 0 &&
          (UVar3 = UnicodeSet::contains(ignorables,AVar5.codePoint), UVar3 == '\0')))) {
        return false;
      }
      bVar2 = hasNext(&local_40,affixPattern);
    } while (bVar2);
  }
  return true;
}

Assistant:

bool AffixUtils::containsOnlySymbolsAndIgnorables(const UnicodeString& affixPattern,
                                                  const UnicodeSet& ignorables, UErrorCode& status) {
    if (affixPattern.length() == 0) {
        return true;
    };
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == TYPE_CODEPOINT && !ignorables.contains(tag.codePoint)) {
            return false;
        }
    }
    return true;
}